

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O3

void __thiscall
wasm::GlobalTypeRewriter::mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::
HeapType>,std::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::
HeapType>>>const&)::CodeUpdater::visitExpression(wasm::Expression__(void *this,Expression *curr)

{
  Id IVar1;
  Type TVar2;
  const_iterator cVar3;
  key_type *pkVar4;
  MemorySize *cast;
  key_type local_20;
  
  if (curr->_id == LocalSetId) {
    if ((curr->type).id < 2) {
      return;
    }
  }
  else if (curr->_id != LocalGetId) {
    TVar2 = getNew(wasm::Type_(this,(curr->type).id);
    (curr->type).id = TVar2.id;
    IVar1 = curr->_id;
    if ((int)IVar1 < 0x15) {
      if ((int)IVar1 < 0xd) {
        if (IVar1 != CallIndirectId) {
          if (IVar1 != InvalidId) {
            return;
          }
LAB_00aa6beb:
          handle_unreachable("unexpected expression type",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                             ,0xb0);
        }
        local_20.id = *(uintptr_t *)(curr + 1);
        if (0xd < local_20.id) {
          cVar3 = std::
                  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(*(_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           **)((long)this + 0x108),&local_20);
          pkVar4 = (key_type *)
                   ((long)cVar3.
                          super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>
                          ._M_cur + 0x10);
          if (cVar3.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>
              ._M_cur == (__node_type *)0x0) {
            pkVar4 = &local_20;
          }
          local_20.id = pkVar4->id;
        }
      }
      else {
        if (IVar1 == StoreId) {
          TVar2 = getNew(wasm::Type_(this,*(uintptr_t *)(curr + 4));
          *(uintptr_t *)(curr + 4) = TVar2.id;
          return;
        }
        if (IVar1 != MemorySizeId) {
          return;
        }
        local_20.id = (uintptr_t)getNew(wasm::Type_(this,*(uintptr_t *)(curr + 1));
      }
      *(uintptr_t *)(curr + 1) = local_20.id;
      return;
    }
    if ((int)IVar1 < 0x39) {
      if (IVar1 == MemoryGrowId) goto LAB_00aa6b7f;
      if (IVar1 != AtomicWaitId) {
        return;
      }
    }
    else {
      if (IVar1 == RefTestId) {
LAB_00aa6b7f:
        TVar2 = getNew(wasm::Type_(this,curr[1].type.id);
        curr[1].type.id = TVar2.id;
        return;
      }
      if (IVar1 != BrOnId) {
        if (IVar1 != NumExpressionIds) {
          return;
        }
        goto LAB_00aa6beb;
      }
    }
    TVar2 = getNew(wasm::Type_(this,*(uintptr_t *)(curr + 3));
    *(uintptr_t *)(curr + 3) = TVar2.id;
    return;
  }
  TVar2 = Function::getLocalType(*(Function **)((long)this + 0xf8),curr[1]._id);
  (curr->type).id = TVar2.id;
  return;
}

Assistant:

void visitExpression(Expression* curr) {
      // local.get and local.tee are special in that their type is tied to the
      // type of the local in the function, which is tied to the signature. That
      // means we must update it based on the signature, and not on the old type
      // in the local.
      //
      // We have already updated function signatures by the time we get here,
      // which means we can just apply the current local type that we see (there
      // is no need to call getNew(), which we already did on the function's
      // signature itself).
      if (auto* get = curr->dynCast<LocalGet>()) {
        curr->type = getFunction()->getLocalType(get->index);
        return;
      } else if (auto* tee = curr->dynCast<LocalSet>()) {
        // Rule out a local.set and unreachable code.
        if (tee->type != Type::none && tee->type != Type::unreachable) {
          curr->type = getFunction()->getLocalType(tee->index);
        }
        return;
      }

      // Update the type to the new one.
      curr->type = getNew(curr->type);

      // Update any other type fields as well.

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id) [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_TYPE(id, field) cast->field = getNew(cast->field);

#define DELEGATE_FIELD_HEAPTYPE(id, field) cast->field = getNew(cast->field);

#define DELEGATE_FIELD_CHILD(id, field)
#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)
#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
    }